

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O1

void __thiscall
CCollision::MoveBox(CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,vec2 Size,float Elasticity,
                   bool *pDeath)

{
  vec2 Pos;
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Size_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar6;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_b8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_b4;
  
  _local_b8 = *pInoutPos;
  fVar11 = (pInoutVel->field_0).x;
  fVar12 = (pInoutVel->field_1).y;
  fVar4 = fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if (pDeath != (bool *)0x0) {
    *pDeath = false;
  }
  if (-1 < (int)fVar4 && 1e-05 < fVar4) {
    iVar3 = (int)fVar4 + 1;
    fVar4 = (float)iVar3;
    do {
      aVar5.x = (1.0 / fVar4) * fVar11 + local_b8.x;
      aVar7.y = (1.0 / fVar4) * fVar12 + aStack_b4.y;
      if ((pDeath != (bool *)0x0) &&
         (Size_00.field_1.y = Size.field_1.y * 0.6666667,
         Size_00.field_0.x = Size.field_0.x * 0.6666667, Pos.field_1.y = aVar7.y,
         Pos.field_0.x = aVar5.x, bVar1 = TestBox(this,Pos,Size_00,2), bVar1)) {
        *pDeath = true;
      }
      Pos_00.field_1.y = aVar7.y;
      Pos_00.field_0.x = aVar5.x;
      bVar1 = TestBox(this,Pos_00,Size,1);
      if (bVar1) {
        Pos_01.field_1.y = aVar7.y;
        Pos_01.field_0.x = local_b8.x;
        bVar1 = TestBox(this,Pos_01,Size,1);
        aVar8 = aStack_b4;
        if (!bVar1) {
          aVar8.y = aVar7.y;
        }
        Pos_02.field_1.y = aStack_b4.y;
        Pos_02.field_0.x = aVar5.x;
        bVar2 = TestBox(this,Pos_02,Size,1);
        aVar6 = local_b8;
        if (!bVar2) {
          aVar6.x = aVar5.x;
        }
        uVar9 = (int)((uint)bVar2 << 0x1f) >> 0x1f;
        uVar10 = (int)((uint)bVar1 << 0x1f) >> 0x1f;
        fVar11 = (float)((uint)(fVar11 * -Elasticity) & uVar9 | ~uVar9 & (uint)fVar11);
        fVar12 = (float)((uint)(fVar12 * -Elasticity) & uVar10 | ~uVar10 & (uint)fVar12);
        if (bVar1) {
          aStack_b4.y = aVar8.y;
          local_b8.x = aVar6.x;
        }
        else if (bVar2) {
          aStack_b4.y = aVar8.y;
          local_b8.x = aVar6.x;
        }
        else {
          fVar11 = fVar11 * -Elasticity;
          fVar12 = fVar12 * -Elasticity;
        }
      }
      else {
        aStack_b4.y = aVar7.y;
        local_b8.x = aVar5.x;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  *pInoutPos = _local_b8;
  (pInoutVel->field_0).x = fVar11;
  (pInoutVel->field_1).y = fVar12;
  return;
}

Assistant:

void CCollision::MoveBox(vec2 *pInoutPos, vec2 *pInoutVel, vec2 Size, float Elasticity, bool *pDeath) const
{
	// do the move
	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;

	const float Distance = length(Vel);
	const int Max = (int)Distance;

	if(pDeath)
		*pDeath = false;

	if(Distance > 0.00001f)
	{
		const float Fraction = 1.0f/(Max+1);
		for(int i = 0; i <= Max; i++)
		{
			vec2 NewPos = Pos + Vel*Fraction; // TODO: this row is not nice

			//You hit a deathtile, congrats to that :)
			//Deathtiles are a bit smaller
			if(pDeath && TestBox(vec2(NewPos.x, NewPos.y), Size*(2.0f/3.0f), COLFLAG_DEATH))
			{
				*pDeath = true;
			}

			if(TestBox(vec2(NewPos.x, NewPos.y), Size))
			{
				int Hits = 0;

				if(TestBox(vec2(Pos.x, NewPos.y), Size))
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					Hits++;
				}

				if(TestBox(vec2(NewPos.x, Pos.y), Size))
				{
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
					Hits++;
				}

				// neither of the tests got a collision.
				// this is a real _corner case_!
				if(Hits == 0)
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
				}
			}

			Pos = NewPos;
		}
	}

	*pInoutPos = Pos;
	*pInoutVel = Vel;
}